

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_try(Parser *parser)

{
  Kind KVar1;
  Token *name;
  Token *name_00;
  List *list;
  void *pvVar2;
  List *stmts;
  Type *type;
  VarTerm *expr;
  CatchStmt *data;
  TryStmt *pTVar3;
  
  expect(parser,TRY);
  expect(parser,OP_FL_BRA);
  list = new_list();
  while (parser->token->kind != CL_FL_BRA) {
    pvVar2 = parse_stmt(parser);
    list_add(list,pvVar2);
    move(parser);
  }
  expect(parser,CL_FL_BRA);
  stmts = new_list();
  while (KVar1 = parser->token->kind, KVar1 == CATCH) {
    expect(parser,CATCH);
    name = parser->token;
    expect(parser,ID);
    expect(parser,COLON);
    name_00 = parser->token;
    KVar1 = name_00->kind;
    if ((4 < KVar1 - STATIC) && (KVar1 != BOOL)) {
      expect(parser,ID);
    }
    type = new_type(name_00);
    expr = new_var_term(name,(void *)0x0,type,(Modifier *)0x0);
    pvVar2 = parse_block(parser);
    data = new_catch_stmt(expr,pvVar2);
    list_add(stmts,data);
  }
  if (KVar1 == FINALLY) {
    expect(parser,FINALLY);
    pvVar2 = parse_block(parser);
  }
  else {
    pvVar2 = (void *)0x0;
  }
  pTVar3 = new_try_stmt(list,stmts,pvVar2);
  return pTVar3;
}

Assistant:

void *parse_try(Parser *parser) {
    expect(parser, TRY);
    expect(parser, OP_FL_BRA);
    List *stmts = new_list();
    while (token(parser)->kind != CL_FL_BRA) {
        list_add(stmts, parse_stmt(parser));
        move(parser);
    }
    expect(parser, CL_FL_BRA);
    List *catch = new_list();
    while (token(parser)->kind == CATCH) {
        expect(parser, CATCH);
        Token *name = token(parser);
        expect(parser, ID);
        expect(parser, COLON);
        Token *type = token(parser);
        if (!is_basic_type(token(parser))) {
            expect(parser, ID);
        }
        list_add(catch, new_catch_stmt(new_var_term(name, NULL, new_type(type), NULL),
                                       parse_block(parser)));
    }
    void *finally = NULL;
    if (token(parser)->kind == FINALLY) {
        expect(parser, FINALLY);
        finally = parse_block(parser);
    }
    return new_try_stmt(stmts, catch, finally);
}